

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

uint8_t * __thiscall LayoutFile::loadTypes(LayoutFile *this,uint8_t *buf,uint count)

{
  int iVar1;
  int iVar2;
  SceneW *this_00;
  undefined4 extraout_var;
  int i;
  bool bVar3;
  int rootWidget;
  LayoutType local_58;
  
  if (buf == (uint8_t *)0x0) {
    return (uint8_t *)0x0;
  }
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    LayoutType::LayoutType(&local_58);
    iVar1 = Util::readInt32(buf,&local_58.widgetIndex);
    iVar2 = Util::readString(buf + iVar1,&local_58.name);
    std::vector<LayoutType,_std::allocator<LayoutType>_>::push_back(&this->types,&local_58);
    buf = buf + iVar1 + iVar2;
    std::__cxx11::string::~string((string *)&local_58.name);
  }
  iVar1 = Util::readInt32(buf,&local_58.widgetIndex);
  bVar3 = std::operator==(&(this->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_58.widgetIndex].name,
                          "Scene");
  if (bVar3) {
    this_00 = (SceneW *)operator_new(200);
    memset(this_00,0,200);
    SceneW::SceneW(this_00);
  }
  else {
    bVar3 = std::operator==(&(this->types).
                             super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
                             super__Vector_impl_data._M_start[local_58.widgetIndex].name,"Panel");
    if (bVar3) {
      this_00 = (SceneW *)operator_new(0xb8);
      memset(this_00,0,0xb8);
      Panel::Panel((Panel *)this_00);
    }
    else {
      bVar3 = std::operator==(&(this->types).
                               super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
                               super__Vector_impl_data._M_start[local_58.widgetIndex].name,
                              "ListPanelItem");
      if (!bVar3) {
        this_00 = (SceneW *)this->root;
        if (this_00 == (SceneW *)0x0) {
          puts("Unsupported root widget\r");
          return buf + iVar1;
        }
        goto LAB_0010b2ae;
      }
      this_00 = (SceneW *)operator_new(0xb8);
      memset(this_00,0,0xb8);
      ListPanelItem::ListPanelItem((ListPanelItem *)this_00);
    }
  }
  this->root = &this_00->super_Widget;
LAB_0010b2ae:
  iVar1 = (*(this_00->super_Widget)._vptr_Widget[1])(this_00,buf + iVar1);
  for (iVar2 = 0; iVar2 < this->root->numChildren; iVar2 = iVar2 + 1) {
    processWidget(this,(uint8_t *)CONCAT44(extraout_var,iVar1),this->root);
  }
  return (uint8_t *)CONCAT44(extraout_var,iVar1);
}

Assistant:

uint8_t *LayoutFile::loadTypes(uint8_t* buf, unsigned int count)
{
	if (buf == nullptr)
		return buf;

	for (int i = 0; i < count; i++)
	{
		LayoutType layoutType;

		buf += Util::readInt32(buf, layoutType.widgetIndex);
		buf += Util::readString(buf, layoutType.name);

		types.push_back(layoutType);
	}

	int rootWidget;
	buf += Util::readInt32(buf, rootWidget);

	if (types[rootWidget].name == "Scene")
	{
		root = new SceneW();
	}
	else if (types[rootWidget].name == "Panel")
	{
		root = new Panel();
	}
	else if (types[rootWidget].name == "ListPanelItem")
	{
		root = new ListPanelItem();
	}
	if (root == nullptr)
	{
		printf("Unsupported root widget\r\n");
		return buf;
	}

	buf = root->read(buf);

	for (int i = 0; i < root->numChildren; i++)
	{
		processWidget(buf, root);
	}

	return buf;
}